

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O2

void prepare_horizontal_filter_coeff(int alpha,int sx,__m256i *coeff)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = av1_filter_8bit[sx >> 10];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = av1_filter_8bit[sx + alpha * 2 >> 10];
  auVar1 = vpunpcklwd_avx(auVar1,auVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = av1_filter_8bit[sx + alpha >> 10];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = av1_filter_8bit[alpha * 3 + sx >> 10];
  auVar2 = vpunpcklwd_avx(auVar2,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = av1_filter_8bit[alpha * 6 + sx >> 10];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = av1_filter_8bit[sx + alpha * 4 >> 10];
  auVar3 = vpunpcklwd_avx(auVar7,auVar6);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = av1_filter_8bit[alpha * 5 + sx >> 10];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = av1_filter_8bit[alpha * 7 + sx >> 10];
  auVar4 = vpunpcklwd_avx(auVar4,auVar8);
  auVar5 = vpunpckldq_avx(auVar1,auVar3);
  auVar1 = vpunpckhdq_avx(auVar1,auVar3);
  auVar3 = vpunpckldq_avx(auVar2,auVar4);
  auVar2 = vpunpckhdq_avx(auVar2,auVar4);
  auVar4 = vpunpcklqdq_avx(auVar5,auVar3);
  *(undefined1 (*) [16])(*coeff + 2) = auVar1;
  *(undefined1 (*) [16])*coeff = auVar4;
  auVar3 = vpunpckhqdq_avx(auVar5,auVar3);
  *(undefined1 (*) [16])(coeff[1] + 2) = auVar1;
  *(undefined1 (*) [16])coeff[1] = auVar3;
  auVar3 = vpunpcklqdq_avx(auVar1,auVar2);
  *(undefined1 (*) [16])(coeff[2] + 2) = auVar1;
  *(undefined1 (*) [16])coeff[2] = auVar3;
  auVar1 = vpunpckhqdq_avx(auVar1,auVar2);
  *(undefined1 (*) [16])(coeff[3] + 2) = auVar1;
  *(undefined1 (*) [16])coeff[3] = auVar1;
  return;
}

Assistant:

static inline void prepare_horizontal_filter_coeff(int alpha, int sx,
                                                   __m256i *coeff) {
  const __m128i tmp_0 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 0 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_1 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 1 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_2 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 2 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_3 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 3 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_4 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 4 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_5 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 5 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_6 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 6 * alpha) >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_7 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + 7 * alpha) >> WARPEDDIFF_PREC_BITS]);

  const __m128i tmp_8 = _mm_unpacklo_epi16(tmp_0, tmp_2);
  const __m128i tmp_9 = _mm_unpacklo_epi16(tmp_1, tmp_3);
  const __m128i tmp_10 = _mm_unpacklo_epi16(tmp_4, tmp_6);
  const __m128i tmp_11 = _mm_unpacklo_epi16(tmp_5, tmp_7);

  const __m128i tmp_12 = _mm_unpacklo_epi32(tmp_8, tmp_10);
  const __m128i tmp_13 = _mm_unpackhi_epi32(tmp_8, tmp_10);
  const __m128i tmp_14 = _mm_unpacklo_epi32(tmp_9, tmp_11);
  const __m128i tmp_15 = _mm_unpackhi_epi32(tmp_9, tmp_11);

  coeff[0] = _mm256_castsi128_si256(_mm_unpacklo_epi64(tmp_12, tmp_14));
  coeff[1] = _mm256_castsi128_si256(_mm_unpackhi_epi64(tmp_12, tmp_14));
  coeff[2] = _mm256_castsi128_si256(_mm_unpacklo_epi64(tmp_13, tmp_15));
  coeff[3] = _mm256_castsi128_si256(_mm_unpackhi_epi64(tmp_13, tmp_15));
}